

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ostream * lexer::operator<<(ostream *os,Token *token)

{
  bool bVar1;
  int *piVar2;
  ostream *poVar3;
  int local_44;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  const_iterator terminalName;
  int maxNameLength;
  Token *token_local;
  ostream *os_local;
  
  terminalName._M_node._4_4_ = 0;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)json::rules::terminalsNames_abi_cxx11_);
  std::
  _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  while( true ) {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)json::rules::terminalsNames_abi_cxx11_);
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(&local_38,&local_40);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_28);
    local_44 = std::__cxx11::string::size();
    piVar2 = std::max<int>((int *)((long)&terminalName._M_node + 4),&local_44);
    terminalName._M_node._4_4_ = *piVar2;
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_28);
  }
  poVar3 = Token::stringify(token,os,(TerminalNames *)json::rules::terminalsNames_abi_cxx11_,
                            terminalName._M_node._4_4_);
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, lexer::Token const& token) {
        int maxNameLength = 0;
        for_each_c(lexer::TerminalNames, json::rules::terminalsNames, terminalName)
            maxNameLength = std::max<int>(maxNameLength, terminalName->second.size());
        return token.stringify(os, json::rules::terminalsNames, maxNameLength);
    }